

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::PrimToPrimSpec(Prim *prim,PrimSpec *ps,string *err)

{
  Model *pMVar1;
  Model *p;
  string *err_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pMVar1 = Prim::as<tinyusdz::Model>(prim);
  if (pMVar1 == (Model *)0x0) {
    if (err != (string *)0x0) {
      ::std::operator+(&local_60,"Unsupported/unimplemented Prim type: ",&prim->_prim_type_name);
      ::std::operator+(&local_40,&local_60,"\n");
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  else {
    p = Prim::as<tinyusdz::Model>(prim);
    PrimToPrimSpecImpl<tinyusdz::Model>(p,ps,err_00);
  }
  return pMVar1 != (Model *)0x0;
}

Assistant:

bool PrimToPrimSpec(const Prim &prim, PrimSpec &ps, std::string *err) {
#define TO_PRIMSPEC(__ty)                                   \
  if (prim.as<__ty>()) {                                    \
    return PrimToPrimSpecImpl(*(prim.as<__ty>()), ps, err); \
  } else

  TO_PRIMSPEC(Model) {
    if (err) {
      (*err) +=
          "Unsupported/unimplemented Prim type: " + prim.prim_type_name() +
          "\n";
    }
    return false;
  }

#undef TO_PRIMSPEC
}